

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser.cc
# Opt level: O1

bool __thiscall tinyusdz::ascii::AsciiParser::ReadUntilNewline(AsciiParser *this,string *str)

{
  string sVar1;
  uint8_t uVar2;
  StreamReader *pSVar3;
  ulong uVar4;
  int iVar5;
  ulong uVar6;
  bool bVar7;
  stringstream ss;
  string local_1d8;
  undefined7 uStack_1d7;
  long local_1c8 [2];
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  ::std::__cxx11::stringstream::stringstream(local_1b8);
  do {
    pSVar3 = this->_sr;
    uVar6 = pSVar3->length_;
    uVar4 = pSVar3->idx_;
    if ((uVar6 <= uVar4) || (pSVar3->binary_[uVar4] == '\0')) goto LAB_0037a4bf;
    if (uVar6 < uVar4 + 1) goto LAB_0037a43d;
    sVar1 = *(string *)(pSVar3->binary_ + uVar4);
    pSVar3->idx_ = uVar4 + 1;
    iVar5 = 3;
    if (sVar1 != (string)0xa) {
      if ((sVar1 == (string)0xd) && (uVar4 = pSVar3->idx_, uVar4 < uVar6 - 1)) {
        if (uVar6 < uVar4 + 1) {
LAB_0037a43d:
          iVar5 = 1;
        }
        else {
          uVar2 = pSVar3->binary_[uVar4];
          pSVar3->idx_ = uVar4 + 1;
          if (uVar2 != '\n') {
            if (((long)pSVar3->idx_ < 1) || (uVar6 = pSVar3->idx_ - 1, pSVar3->length_ < uVar6))
            goto LAB_0037a43d;
            pSVar3->idx_ = uVar6;
          }
        }
      }
      else {
        local_1d8 = sVar1;
        ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,(char *)&local_1d8,1);
        iVar5 = 0;
      }
    }
  } while (iVar5 == 0);
  if (iVar5 == 3) {
LAB_0037a4bf:
    (this->_curr_cursor).row = (this->_curr_cursor).row + 1;
    (this->_curr_cursor).col = 0;
    ::std::__cxx11::stringbuf::str();
    ::std::__cxx11::string::operator=((string *)str,&local_1d8);
    if ((long *)CONCAT71(uStack_1d7,local_1d8) != local_1c8) {
      operator_delete((long *)CONCAT71(uStack_1d7,local_1d8),local_1c8[0] + 1);
    }
    bVar7 = true;
  }
  else {
    bVar7 = false;
  }
  ::std::__cxx11::stringstream::~stringstream(local_1b8);
  ::std::ios_base::~ios_base(local_138);
  return bVar7;
}

Assistant:

bool AsciiParser::ReadUntilNewline(std::string *str) {
  std::stringstream ss;

  while (!Eof()) {
    char c;
    if (!Char1(&c)) {
      // this should not happen.
      return false;
    }

    if (c == '\n') {
      break;
    } else if (c == '\r') {
      // CRLF?
      if (_sr->tell() < (_sr->size() - 1)) {
        char d;
        if (!Char1(&d)) {
          // this should not happen.
          return false;
        }

        if (d == '\n') {
          break;
        }

        // unwind 1 char
        if (!_sr->seek_from_current(-1)) {
          // this should not happen.
          return false;
        }

        break;
      }
    }

    ss << c;
  }

  _curr_cursor.row++;
  _curr_cursor.col = 0;

  (*str) = ss.str();

  return true;
}